

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O2

TestCaseGroup * vkt::SpirVAssembly::createMemoryAccessTests(TestContext *testCtx)

{
  TestCaseGroup *pTVar1;
  mapped_type *pmVar2;
  long lVar3;
  allocator<char> local_9d8;
  allocator<char> local_9d7;
  allocator<char> local_9d6;
  allocator<char> local_9d5;
  allocator<char> local_9d4;
  allocator<char> local_9d3;
  allocator<char> local_9d2;
  allocator<char> local_9d1;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> memoryAccessTests;
  string local_9c0;
  string *local_9a0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  memoryAccess;
  RGBA colors [4];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragments;
  key_type local_928;
  string local_908;
  allocator<char> local_8e8 [32];
  NameMemoryAccess tests [7];
  char constantsAndTypes [223];
  char function [1519];
  
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,"opmemoryaccess","Memory Semantics");
  colors[0].m_value = 0;
  colors[1].m_value = 0;
  colors[2].m_value = 0;
  colors[3].m_value = 0;
  memoryAccessTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = pTVar1;
  memcpy(constantsAndTypes,
         "%c_a2f32_1         = OpConstantComposite %a2f32 %c_f32_1 %c_f32_1\n%fp_a2f32          = OpTypePointer Function %a2f32\n%stype             = OpTypeStruct  %v4f32 %a2f32 %f32\n%fp_stype          = OpTypePointer Function %stype\n"
         ,0xdf);
  memcpy(function,
         "%test_code         = OpFunction %v4f32 None %v4f32_function\n%param1            = OpFunctionParameter %v4f32\n%lbl               = OpLabel\n%v1                = OpVariable %fp_v4f32 Function\n%v2                = OpVariable %fp_a2f32 Function\n%v3                = OpVariable %fp_f32 Function\n%v                 = OpVariable %fp_stype Function\n%vv                = OpVariable %fp_stype Function\n%vvv               = OpVariable %fp_f32 Function\n                     OpStore %v1 %c_v4f32_1_1_1_1\n                     OpStore %v2 %c_a2f32_1\n                     OpStore %v3 %c_f32_1\n%p_v4f32          = OpAccessChain %fp_v4f32 %v %c_u32_0\n%p_a2f32          = OpAccessChain %fp_a2f32 %v %c_u32_1\n%p_f32            = OpAccessChain %fp_f32 %v %c_u32_2\n%v1_v             = OpLoad %v4f32 %v1 ${access_type}\n%v2_v             = OpLoad %a2f32 %v2 ${access_type}\n%v3_v             = OpLoad %f32 %v3 ${access_type}\n                    OpStore %p_v4f32 %v1_v ${access_type}\n                    OpStore %p_a2f32 %v2_v ${access_type}\n                    OpStore %p_f32 %v3_v ${access_type}\n                    OpCopyMemory %vv %v ${access_type}\n                    OpCopyMemory %vvv %p_f32 ${access_type}\n%p_f32_2          = OpAccessChain %fp_f32 %vv %c_u32_2\n%v_f32_2          = OpLoad %f32 %p_f32_2\n%v_f32_3          = OpLoad %f32 %vvv\n%ret1             = OpVectorTimesScalar %v4f32 %param1 %v_f32_2\n%ret2             = OpVectorTimesScalar %v4f32 %ret1 %v_f32_3\n                    OpReturnValue %ret2\n                    OpFunctionEnd\n"
         ,0x5ef);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)tests,"none",(allocator<char> *)&fragments);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests[0].accessType,"",(allocator<char> *)&memoryAccess);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests + 1),"volatile",(allocator<char> *)&local_9c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests[1].accessType,"Volatile",local_8e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests + 2),"aligned",(allocator<char> *)&local_908);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests[2].accessType,"Aligned 1",(allocator<char> *)&local_928);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests + 3),"volatile_aligned",&local_9d7);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests[3].accessType,"Volatile|Aligned 1",&local_9d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests + 4),"nontemporal_aligned",&local_9d1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests[4].accessType,"Nontemporal|Aligned 1",&local_9d2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests + 5),"volatile_nontemporal",&local_9d3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests[5].accessType,"Volatile|Nontemporal",&local_9d4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests + 6),"volatile_nontermporal_aligned",&local_9d5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests[6].accessType,"Volatile|Nontemporal|Aligned 1",&local_9d6);
  getHalfColorsFullAlpha(&colors);
  for (lVar3 = 0;
      pTVar1 = memoryAccessTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr, lVar3 != 0x1c0; lVar3 = lVar3 + 0x40) {
    fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &fragments._M_t._M_impl.super__Rb_tree_header._M_header;
    fragments._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    memoryAccess._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    memoryAccess._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    memoryAccess._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &memoryAccess._M_t._M_impl.super__Rb_tree_header._M_header;
    memoryAccess._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    memoryAccess._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         memoryAccess._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_9c0,"access_type",local_8e8)
    ;
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&memoryAccess,&local_9c0);
    std::__cxx11::string::_M_assign((string *)pmVar2);
    std::__cxx11::string::~string((string *)&local_9c0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_9c0,"pre_main",local_8e8);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&fragments._M_t,&local_9c0);
    std::__cxx11::string::assign((char *)pmVar2);
    std::__cxx11::string::~string((string *)&local_9c0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_908,function,&local_9d7);
    tcu::StringTemplate::StringTemplate((StringTemplate *)local_8e8,&local_908);
    tcu::StringTemplate::specialize(&local_9c0,(StringTemplate *)local_8e8,&memoryAccess);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_928,"testfun",&local_9d8);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&fragments._M_t,&local_928);
    local_9a0 = (string *)((long)&tests[0].name._M_dataplus._M_p + lVar3);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_9c0);
    std::__cxx11::string::~string((string *)&local_928);
    std::__cxx11::string::~string((string *)&local_9c0);
    tcu::StringTemplate::~StringTemplate((StringTemplate *)local_8e8);
    std::__cxx11::string::~string((string *)&local_908);
    local_9c0._M_dataplus._M_p = (pointer)&local_9c0.field_2;
    local_9c0._M_string_length = 0;
    local_9c0.field_2._M_local_buf[0] = '\0';
    createTestsForAllStages
              (local_9a0,&colors,&colors,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&fragments._M_t,
               memoryAccessTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr,QP_TEST_RESULT_FAIL,&local_9c0);
    std::__cxx11::string::~string((string *)&local_9c0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&memoryAccess._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&fragments._M_t);
  }
  memoryAccessTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  lVar3 = 0x180;
  do {
    createMemoryAccessTests::NameMemoryAccess::~NameMemoryAccess
              ((NameMemoryAccess *)((long)&tests[0].name._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0x40;
  } while (lVar3 != -0x40);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&memoryAccessTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createMemoryAccessTests(tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> memoryAccessTests (new tcu::TestCaseGroup(testCtx, "opmemoryaccess", "Memory Semantics"));
	RGBA							colors[4];

	const char						constantsAndTypes[]	 =
		"%c_a2f32_1         = OpConstantComposite %a2f32 %c_f32_1 %c_f32_1\n"
		"%fp_a2f32          = OpTypePointer Function %a2f32\n"
		"%stype             = OpTypeStruct  %v4f32 %a2f32 %f32\n"
		"%fp_stype          = OpTypePointer Function %stype\n";

	const char						function[]	 =
		"%test_code         = OpFunction %v4f32 None %v4f32_function\n"
		"%param1            = OpFunctionParameter %v4f32\n"
		"%lbl               = OpLabel\n"
		"%v1                = OpVariable %fp_v4f32 Function\n"
		"%v2                = OpVariable %fp_a2f32 Function\n"
		"%v3                = OpVariable %fp_f32 Function\n"
		"%v                 = OpVariable %fp_stype Function\n"
		"%vv                = OpVariable %fp_stype Function\n"
		"%vvv               = OpVariable %fp_f32 Function\n"

		"                     OpStore %v1 %c_v4f32_1_1_1_1\n"
		"                     OpStore %v2 %c_a2f32_1\n"
		"                     OpStore %v3 %c_f32_1\n"

		"%p_v4f32          = OpAccessChain %fp_v4f32 %v %c_u32_0\n"
		"%p_a2f32          = OpAccessChain %fp_a2f32 %v %c_u32_1\n"
		"%p_f32            = OpAccessChain %fp_f32 %v %c_u32_2\n"
		"%v1_v             = OpLoad %v4f32 %v1 ${access_type}\n"
		"%v2_v             = OpLoad %a2f32 %v2 ${access_type}\n"
		"%v3_v             = OpLoad %f32 %v3 ${access_type}\n"

		"                    OpStore %p_v4f32 %v1_v ${access_type}\n"
		"                    OpStore %p_a2f32 %v2_v ${access_type}\n"
		"                    OpStore %p_f32 %v3_v ${access_type}\n"

		"                    OpCopyMemory %vv %v ${access_type}\n"
		"                    OpCopyMemory %vvv %p_f32 ${access_type}\n"

		"%p_f32_2          = OpAccessChain %fp_f32 %vv %c_u32_2\n"
		"%v_f32_2          = OpLoad %f32 %p_f32_2\n"
		"%v_f32_3          = OpLoad %f32 %vvv\n"

		"%ret1             = OpVectorTimesScalar %v4f32 %param1 %v_f32_2\n"
		"%ret2             = OpVectorTimesScalar %v4f32 %ret1 %v_f32_3\n"
		"                    OpReturnValue %ret2\n"
		"                    OpFunctionEnd\n";

	struct NameMemoryAccess
	{
		string name;
		string accessType;
	};


	NameMemoryAccess tests[] =
	{
		{ "none", "" },
		{ "volatile", "Volatile" },
		{ "aligned",  "Aligned 1" },
		{ "volatile_aligned",  "Volatile|Aligned 1" },
		{ "nontemporal_aligned",  "Nontemporal|Aligned 1" },
		{ "volatile_nontemporal",  "Volatile|Nontemporal" },
		{ "volatile_nontermporal_aligned",  "Volatile|Nontemporal|Aligned 1" },
	};

	getHalfColorsFullAlpha(colors);

	for (size_t testNdx = 0; testNdx < sizeof(tests) / sizeof(NameMemoryAccess); ++testNdx)
	{
		map<string, string> fragments;
		map<string, string> memoryAccess;
		memoryAccess["access_type"] = tests[testNdx].accessType;

		fragments["pre_main"] = constantsAndTypes;
		fragments["testfun"] = tcu::StringTemplate(function).specialize(memoryAccess);
		createTestsForAllStages(tests[testNdx].name, colors, colors, fragments, memoryAccessTests.get());
	}
	return memoryAccessTests.release();
}